

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_pattern
          (ansicolor_sink<spdlog::details::console_mutex> *this,string *pattern)

{
  pthread_mutex_t *__mutex;
  formatter *pfVar1;
  pattern_formatter *this_00;
  allocator local_99;
  string local_98;
  string local_78;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = (pattern_formatter *)operator_new(0xe0);
  std::__cxx11::string::string((string *)&local_78,(string *)pattern);
  std::__cxx11::string::string((string *)&local_98,"\n",&local_99);
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  pattern_formatter::pattern_formatter(this_00,&local_78,local,&local_98,(custom_flags *)&local_58);
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_00;
  if (pfVar1 != (formatter *)0x0) {
    (*pfVar1->_vptr_formatter[1])();
  }
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_pattern(const std::string &pattern) {
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
}